

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O0

double boxcox(double *x,int N,double *lambda,double *y)

{
  double *__ptr;
  undefined1 local_60 [8];
  custom_funcuni boxcox_mle;
  int cn;
  int cc;
  double b;
  double a;
  double lmbd;
  double *params;
  double *y_local;
  double *lambda_local;
  int N_local;
  double *x_local;
  
  boxcox_mle.params._4_4_ = checkConstant(x,N);
  if (boxcox_mle.params._4_4_ == 1) {
    printf("Input is a constant vector. Exiting. \n");
    exit(-1);
  }
  if ((int)boxcox_mle.params == 1) {
    printf("Input vector cannot have negative values. Exiting. \n");
    exit(-1);
  }
  __ptr = (double *)malloc((long)(N + 1) << 3);
  *__ptr = (double)N;
  memcpy(__ptr + 1,x,(long)N << 3);
  local_60 = (undefined1  [8])boxcox_loglik;
  boxcox_mle.funcuni = (_func_double_double_void_ptr *)__ptr;
  if (lambda == (double *)0x0) {
    a = fminbnd((custom_funcuni *)local_60,-2.0,2.0);
  }
  else {
    a = *lambda;
  }
  boxcox_eval(x,N,a,y);
  free(__ptr);
  return a;
}

Assistant:

double boxcox(double *x, int N,double *lambda,double *y) {
    double *params;
    double lmbd,a,b;
    int cc,cn;

    // Check if x has all constant values
    cc = checkConstant(x,N);

    if (cc == 1) {
        printf("Input is a constant vector. Exiting. \n");
        exit(-1);
    }

    // Check for negative values

    if (cn == 1) {
        printf("Input vector cannot have negative values. Exiting. \n");
        exit(-1);
    }

    params = (double*) malloc(sizeof(double)*(N+1));

    params[0] = (double) N;
    memcpy(params+1,x,sizeof(double)*N);

    custom_funcuni boxcox_mle = {boxcox_loglik,params};

    if (lambda == NULL) {
        a = -2;
        b = 2;
        lmbd = fminbnd(&boxcox_mle,a,b);
    } else {
        lmbd = *lambda;
    }

    boxcox_eval(x,N,lmbd,y);

    free(params);
    return lmbd;
}